

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisNodeHandlerVectorLength
          (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xfb1,
                  "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    if (index == (ZyanU16 *)0x0) {
      __assert_fail("index",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xfb3,
                    "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                   );
    }
    switch(instruction->encoding) {
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
      if ((instruction->attributes & 8) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 3)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfb8,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
      if ((instruction->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfbb,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
      if ((instruction->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfbe,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
      if ((instruction->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfc1,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xfc4,
                    "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                   );
    }
    *index = (ushort)(context->vector_unified).LL;
    if (*index == 3) {
      context_local._4_4_ = 0x80200001;
    }
    else {
      context_local._4_4_ = 0x100000;
    }
    return context_local._4_4_;
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0xfb2,
                "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
               );
}

Assistant:

static ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext* context,
    const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_XOP);
        break;
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_VEX);
        break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_EVEX);
        break;
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MVEX);
        break;
    default:
        ZYAN_UNREACHABLE;
    }

    *index = context->vector_unified.LL;
    if (*index == 3)
    {
        return ZYDIS_STATUS_DECODING_ERROR;
    }
    return ZYAN_STATUS_SUCCESS;
}